

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::UnitTestOptions::GetOutputFormat_abi_cxx11_(void)

{
  char *__s;
  char *pcVar1;
  string *in_RDI;
  long in_FS_OFFSET;
  allocator<char> local_19;
  long local_18;
  
  __s = FLAGS_gtest_output_abi_cxx11_;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = strchr(FLAGS_gtest_output_abi_cxx11_,0x3a);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,&local_19);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_00142095;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_00142095:
      __stack_chk_fail();
    }
    std::__cxx11::string::_M_construct<char_const*>();
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetOutputFormat() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  const char* const colon = strchr(gtest_output_flag, ':');
  return (colon == NULL) ?
      std::string(gtest_output_flag) :
      std::string(gtest_output_flag, colon - gtest_output_flag);
}